

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::visitStringNew(BinaryInstWriter *this,StringNew *curr)

{
  StringNewOp SVar1;
  bool bVar2;
  size_t in_RCX;
  void *__buf;
  int __fd;
  LEB<unsigned_int,_unsigned_char> *this_00;
  LEB<unsigned_int,_unsigned_char> local_28;
  LEB<unsigned_int,_unsigned_char> local_24;
  LEB<unsigned_int,_unsigned_char> local_20;
  uchar local_1a [2];
  
  bVar2 = wasm::Type::isNull(&curr->ref->type);
  if (bVar2) {
    local_1a[1] = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,local_1a + 1);
  }
  else {
    local_1a[0] = 0xfb;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,local_1a);
    SVar1 = curr->op;
    if (SVar1 == StringNewFromCodePoint) {
      __fd = (int)this->o;
      this_00 = &local_28;
      local_28.value = 0xa9;
    }
    else if (SVar1 == StringNewWTF16Array) {
      __fd = (int)this->o;
      this_00 = &local_24;
      local_24.value = 0xb1;
    }
    else {
      if (SVar1 != StringNewLossyUTF8Array) {
        handle_unreachable("invalid string.new*",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x9fa);
      }
      __fd = (int)this->o;
      this_00 = &local_20;
      local_20.value = 0xb4;
    }
    LEB<unsigned_int,_unsigned_char>::write(this_00,__fd,__buf,in_RCX);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitStringNew(StringNew* curr) {
  if (curr->ref->type.isNull()) {
    // This is a bottom type, so this is an array-receiving operation that does
    // not receive an array. The spec allows this, but V8 does not, see
    // https://github.com/WebAssembly/stringref/issues/66
    // For now, just emit an unreachable here as this will definitely trap.
    emitUnreachable();
    return;
  }
  o << int8_t(BinaryConsts::GCPrefix);
  switch (curr->op) {
    case StringNewLossyUTF8Array:
      o << U32LEB(BinaryConsts::StringNewLossyUTF8Array);
      break;
    case StringNewWTF16Array:
      o << U32LEB(BinaryConsts::StringNewWTF16Array);
      break;
    case StringNewFromCodePoint:
      o << U32LEB(BinaryConsts::StringFromCodePoint);
      break;
    default:
      WASM_UNREACHABLE("invalid string.new*");
  }
}